

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  size_t sVar2;
  
  poVar1 = (this->super_StreamingReporterBase).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001b2600 = 0x2d2d2d2d2d2d2d;
    uRam00000000001b2607 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001b25f0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b25f8 = 0x2d2d2d2d2d2d2d;
    DAT_001b25ff = 0x2d;
    _DAT_001b25e0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b25e8 = 0x2d2d2d2d2d2d2d2d;
    _DAT_001b25d0 = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b25d8 = 0x2d2d2d2d2d2d2d2d;
    _line = 0x2d2d2d2d2d2d2d2d;
    uRam00000000001b25c8 = 0x2d2d2d2d2d2d2d2d;
    DAT_001b260f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

void printSummaryDivider() {
            stream << getLineOfChars<'-'>() << "\n";
        }